

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkconforming(tetgenmesh *this,int flag)

{
  double *p1;
  point pdVar1;
  point pt;
  double dVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  point pdVar9;
  point p1_00;
  double elen [3];
  int local_1b8 [2];
  int indx [4];
  double local_1a0;
  double D;
  double rhs [4];
  double A [4] [4];
  int i;
  int t1ver;
  int encsubfaces;
  int encsubsegs;
  bool enq;
  double len;
  double rd;
  double diff;
  double dist;
  double radius;
  double cent [3];
  point pc;
  point pb;
  point pa;
  point eapex;
  point edest;
  point eorg;
  face segloop;
  face shloop;
  triface spintet;
  triface neightet;
  triface searchtet;
  int flag_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&shloop.shver);
  face::face((face *)&segloop.shver);
  face::face((face *)&eorg);
  t1ver = 0;
  if ((flag & 1U) != 0) {
    if (this->b->quiet == 0) {
      printf("  Checking conforming property of segments...\n");
    }
    t1ver = 0;
    memorypool::traversalinit(this->subsegs);
    eorg = (point)shellfacetraverse(this,this->subsegs);
    while (eorg != (point)0x0) {
      p1 = (double *)eorg[3];
      pdVar1 = (point)eorg[4];
      dVar2 = distance(this,p1,pdVar1);
      for (A[3][3]._4_4_ = 0; A[3][3]._4_4_ < 3; A[3][3]._4_4_ = A[3][3]._4_4_ + 1) {
        cent[(long)A[3][3]._4_4_ + -1] = (p1[A[3][3]._4_4_] + pdVar1[A[3][3]._4_4_]) * 0.5;
      }
      bVar5 = false;
      sstpivot1(this,(face *)&eorg,(triface *)&spintet.ver);
      if (spintet._8_8_ != 0) {
        triface::operator=((triface *)&shloop.shver,(triface *)&spintet.ver);
        do {
          pdVar9 = apex(this,(triface *)&shloop.shver);
          if (pdVar9 != this->dummypoint) {
            dVar3 = distance(this,pdVar9,&radius);
            rd = dVar3 - dVar2 * 0.5;
            if (ABS(rd) / (dVar2 * 0.5) <= this->b->epsilon) {
              rd = 0.0;
            }
            if (rd < 0.0) {
              bVar5 = true;
              break;
            }
          }
          iVar4 = (int)spintet.tet;
          decode(this,*(tetrahedron *)(shloop._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                 (triface *)&shloop.shver);
          spintet.tet._0_4_ = facepivot2[iVar4][(int)spintet.tet];
        } while (shloop._8_8_ != spintet._8_8_);
      }
      if (bVar5) {
        uVar6 = pointmark(this,p1);
        uVar7 = pointmark(this,pdVar1);
        printf("  !! !! Non-conforming segment: (%d, %d)\n",(ulong)uVar6,(ulong)uVar7);
        t1ver = t1ver + 1;
      }
      eorg = (point)shellfacetraverse(this,this->subsegs);
    }
    if (t1ver == 0) {
      if (this->b->quiet == 0) {
        printf("  The segments are conforming Delaunay.\n");
      }
    }
    else {
      printf("  !! !! %d subsegments are non-conforming.\n",(ulong)(uint)t1ver);
    }
  }
  i = 0;
  if ((flag & 2U) != 0) {
    if (this->b->quiet == 0) {
      printf("  Checking conforming property of subfaces...\n");
    }
    memorypool::traversalinit(this->subfaces);
    segloop._8_8_ = shellfacetraverse(this,this->subfaces);
    while (segloop._8_8_ != 0) {
      pdVar1 = *(point *)(segloop._8_8_ + 0x18);
      pdVar9 = *(point *)(segloop._8_8_ + 0x20);
      pt = *(point *)(segloop._8_8_ + 0x28);
      rhs[3] = *pdVar9 - *pdVar1;
      A[0][0] = pdVar9[1] - pdVar1[1];
      A[0][1] = pdVar9[2] - pdVar1[2];
      A[0][3] = *pt - *pdVar1;
      A[1][0] = pt[1] - pdVar1[1];
      A[1][1] = pt[2] - pdVar1[2];
      cross(this,rhs + 3,A[0] + 3,A[1] + 3);
      dVar2 = dot(this,rhs + 3,rhs + 3);
      dVar3 = dot(this,A[0] + 3,A[0] + 3);
      D = dVar2 * 0.5;
      rhs[0] = dVar3 * 0.5;
      rhs[1] = 0.0;
      bVar5 = lu_decmp(this,(double (*) [4])(rhs + 3),3,local_1b8,&local_1a0,0);
      if (bVar5) {
        lu_solve(this,(double (*) [4])(rhs + 3),3,local_1b8,&D,0);
        radius = *pdVar1 + D;
        cent[0] = pdVar1[1] + rhs[0];
        cent[1] = pdVar1[2] + rhs[1];
        dVar2 = sqrt(rhs[1] * rhs[1] + D * D + rhs[0] * rhs[0]);
        for (A[3][3]._4_4_ = 0; A[3][3]._4_4_ < 2; A[3][3]._4_4_ = A[3][3]._4_4_ + 1) {
          stpivot(this,(face *)&segloop.shver,(triface *)&neightet.ver);
          bVar5 = ishulltet(this,(triface *)&neightet.ver);
          if (!bVar5) {
            p1_00 = oppo(this,(triface *)&neightet.ver);
            _encsubsegs = distance(this,p1_00,&radius);
            if (ABS(_encsubsegs - dVar2) / dVar2 < this->b->epsilon) {
              _encsubsegs = dVar2;
            }
            if (_encsubsegs < dVar2) {
              uVar6 = pointmark(this,pdVar1);
              uVar7 = pointmark(this,pdVar9);
              uVar8 = pointmark(this,pt);
              printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",(ulong)uVar6,(ulong)uVar7,
                     (ulong)uVar8);
              i = i + 1;
              break;
            }
          }
          sesymself(this,(face *)&segloop.shver);
        }
      }
      segloop._8_8_ = shellfacetraverse(this,this->subfaces);
    }
    if (i == 0) {
      if (this->b->quiet == 0) {
        printf("  The subfaces are conforming Delaunay.\n");
      }
    }
    else {
      printf("  !! !! %d subfaces are non-conforming.\n",(ulong)(uint)i);
    }
  }
  return t1ver + i;
}

Assistant:

int tetgenmesh::checkconforming(int flag)
{
  triface searchtet, neightet, spintet;
  face shloop;
  face segloop;
  point eorg, edest, eapex, pa, pb, pc;
  REAL cent[3], radius, dist, diff, rd, len;
  bool enq;
  int encsubsegs, encsubfaces;
  int t1ver; 
  int i;

  REAL A[4][4], rhs[4], D;
  int indx[4];
  REAL elen[3];

  encsubsegs = 0;

  if (flag & 1) {
    if (!b->quiet) {
      printf("  Checking conforming property of segments...\n");
    }
    encsubsegs = 0;

    // Run through the list of subsegments, check each one.
    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      eorg = (point) segloop.sh[3];
      edest = (point) segloop.sh[4];
      radius = 0.5 * distance(eorg, edest);
      for (i = 0; i < 3; i++) cent[i] = 0.5 * (eorg[i] + edest[i]);

      enq = false;
      sstpivot1(segloop, neightet);
      if (neightet.tet != NULL) {
        spintet = neightet;
        while (1) {
          eapex= apex(spintet);
          if (eapex != dummypoint) {
            dist = distance(eapex, cent);
            diff = dist - radius;
            if (fabs(diff) / radius <= b->epsilon) diff = 0.0; // Rounding.
            if (diff < 0) {
              enq = true; break;
            }
          }
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
      }
      if (enq) {
        printf("  !! !! Non-conforming segment: (%d, %d)\n",
               pointmark(eorg), pointmark(edest));
        encsubsegs++;
      }
      segloop.sh = shellfacetraverse(subsegs);
    }

    if (encsubsegs == 0) {
      if (!b->quiet) {
        printf("  The segments are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subsegments are non-conforming.\n", encsubsegs);
    }
  } // if (flag & 1)

  encsubfaces = 0;

  if (flag & 2) {
    if (!b->quiet) {
      printf("  Checking conforming property of subfaces...\n");
    }

    // Run through the list of subfaces, check each one.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      pa = (point) shloop.sh[3];
      pb = (point) shloop.sh[4];
      pc = (point) shloop.sh[5];

      // Compute the coefficient matrix A (3x3).
      A[0][0] = pb[0] - pa[0];
      A[0][1] = pb[1] - pa[1];
      A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
      A[1][0] = pc[0] - pa[0];
      A[1][1] = pc[1] - pa[1];
      A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
      cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

      // Compute the right hand side vector b (3x1).
      elen[0] = dot(A[0], A[0]);
      elen[1] = dot(A[1], A[1]);
      rhs[0] = 0.5 * elen[0];
      rhs[1] = 0.5 * elen[1];
      rhs[2] = 0.0;

      if (lu_decmp(A, 3, indx, &D, 0)) {
        lu_solve(A, 3, indx, rhs, 0);
        cent[0] = pa[0] + rhs[0];
        cent[1] = pa[1] + rhs[1];
        cent[2] = pa[2] + rhs[2];
        rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

        // Check if this subface is encroached.
        for (i = 0; i < 2; i++) {
          stpivot(shloop, searchtet);
          if (!ishulltet(searchtet)) {
            len = distance(oppo(searchtet), cent);
            if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
            if (len < rd) {
              printf("  !! !! Non-conforming subface: (%d, %d, %d)\n",
                     pointmark(pa), pointmark(pb), pointmark(pc));
              encsubfaces++;
              enq = true; break;
            }
          }
          sesymself(shloop);
        }
      }
      shloop.sh = shellfacetraverse(subfaces);
    }

    if (encsubfaces == 0) {
      if (!b->quiet) {
        printf("  The subfaces are conforming Delaunay.\n");
      }
    } else {
      printf("  !! !! %d subfaces are non-conforming.\n", encsubfaces);
    }
  } // if (flag & 2)

  return encsubsegs + encsubfaces;
}